

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PropertyMap.cpp
# Opt level: O0

void __thiscall
OpenMD::PropertyMap::addProperty(PropertyMap *this,shared_ptr<OpenMD::GenericData> *genData)

{
  bool bVar1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<OpenMD::GenericData>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<OpenMD::GenericData>_>_>_>
  *this_00;
  long in_RDI;
  __enable_if_t<is_constructible<value_type,_pair<basic_string<char>,_shared_ptr<GenericData>_>_>::value,_pair<iterator,_bool>_>
  _Var2;
  iterator iter;
  GenericData *in_stack_fffffffffffffef8;
  undefined7 in_stack_ffffffffffffff00;
  undefined1 in_stack_ffffffffffffff07;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<OpenMD::GenericData>_>
  *in_stack_ffffffffffffff08;
  string local_a8 [80];
  _Self local_58 [3];
  string local_40 [32];
  _Base_ptr local_20;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<OpenMD::GenericData>_>_>
  local_18 [3];
  
  std::
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<OpenMD::GenericData>_>_>
  ::_Rb_tree_iterator(local_18);
  std::__shared_ptr_access<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x38dc2e);
  GenericData::getID_abi_cxx11_(in_stack_fffffffffffffef8);
  local_20 = (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<OpenMD::GenericData>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<OpenMD::GenericData>_>_>_>
             ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<OpenMD::GenericData>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<OpenMD::GenericData>_>_>_>
                     *)in_stack_fffffffffffffef8,(key_type *)0x38dc52);
  local_18[0]._M_node = local_20;
  std::__cxx11::string::~string(local_40);
  local_58[0]._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<OpenMD::GenericData>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<OpenMD::GenericData>_>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<OpenMD::GenericData>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<OpenMD::GenericData>_>_>_>
              *)in_stack_fffffffffffffef8);
  bVar1 = std::operator==(local_18,local_58);
  if (bVar1) {
    this_00 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<OpenMD::GenericData>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<OpenMD::GenericData>_>_>_>
               *)(in_RDI + 8);
    std::__shared_ptr_access<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
               )0x38dccf);
    GenericData::getID_abi_cxx11_(in_stack_fffffffffffffef8);
    std::make_pair<std::__cxx11::string_const,std::shared_ptr<OpenMD::GenericData>&>
              (&in_stack_ffffffffffffff08->first,
               (shared_ptr<OpenMD::GenericData> *)
               CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00));
    _Var2 = std::
            map<std::__cxx11::string,std::shared_ptr<OpenMD::GenericData>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<OpenMD::GenericData>>>>
            ::insert<std::pair<std::__cxx11::string,std::shared_ptr<OpenMD::GenericData>>>
                      (this_00,in_stack_ffffffffffffff08);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<OpenMD::GenericData>_>
    ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<OpenMD::GenericData>_>
             *)CONCAT17(_Var2.second,in_stack_ffffffffffffff00));
    std::__cxx11::string::~string(local_a8);
  }
  else {
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<OpenMD::GenericData>_>_>
    ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<OpenMD::GenericData>_>_>
                  *)0x38ddb8);
    std::shared_ptr<OpenMD::GenericData>::operator=
              ((shared_ptr<OpenMD::GenericData> *)
               CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00),
               (shared_ptr<OpenMD::GenericData> *)in_stack_fffffffffffffef8);
  }
  return;
}

Assistant:

void PropertyMap::addProperty(std::shared_ptr<GenericData> genData) {
    std::map<std::string, std::shared_ptr<GenericData>>::iterator iter;

    iter = propMap_.find(genData->getID());

    if (iter == propMap_.end()) {
      propMap_.insert(std::make_pair(genData->getID(), genData));
    } else {
      iter->second = genData;
    }
  }